

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_csv_parser.cpp
# Opt level: O1

void __thiscall csv::internals::IBasicCSVParser::end_feed(IBasicCSVParser *this)

{
  ParseFlags PVar1;
  element_type *peVar2;
  bool bVar3;
  size_t sVar4;
  
  peVar2 = (this->data_ptr).
           super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (((peVar2 == (element_type *)0x0) ||
      ((peVar2->_data).super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
       (element_type *)0x0)) || (sVar4 = (peVar2->data)._M_len, sVar4 == 0)) {
    bVar3 = false;
  }
  else {
    PVar1 = (this->_parse_flags)._M_elems[(int)(peVar2->data)._M_str[sVar4 - 1] + 0x80];
    bVar3 = PVar1 == QUOTE || PVar1 == DELIMITER;
  }
  if ((bVar3) || (this->field_length != 0)) {
    push_field(this);
  }
  if ((this->current_row).row_length != 0) {
    sVar4 = CSVFieldList::size(this->fields);
    (this->current_row).row_length = sVar4 - (this->current_row).fields_start;
    ThreadSafeDeque<csv::CSVRow>::push_back(this->_records,&this->current_row);
    return;
  }
  return;
}

Assistant:

CSV_INLINE void IBasicCSVParser::end_feed() {
            using internals::ParseFlags;

            bool empty_last_field = this->data_ptr
                && this->data_ptr->_data
                && !this->data_ptr->data.empty()
                && (parse_flag(this->data_ptr->data.back()) == ParseFlags::DELIMITER
                    || parse_flag(this->data_ptr->data.back()) == ParseFlags::QUOTE);

            // Push field
            if (this->field_length > 0 || empty_last_field) {
                this->push_field();
            }

            // Push row
            if (this->current_row.size() > 0)
                this->push_row();
        }